

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryThenFinallyFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int n;
  CallFlags e;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  JavascriptLibrary *this;
  JavascriptPromiseThenFinallyFunction *this_00;
  RecyclableObject *pRVar8;
  RecyclableObject *pRVar9;
  JavascriptMethod p_Var10;
  CallInfo CVar11;
  Var pvVar12;
  JavascriptLibrary *this_01;
  JavascriptPromiseThunkFinallyFunction *pJVar13;
  Var aValue;
  CallInfo local_e0;
  CallInfo local_d8;
  undefined1 local_d0 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  RecyclableObject *func;
  Var funcVar;
  RecyclableObject *promise;
  JavascriptPromiseThunkFinallyFunction *thunkFinallyFunction;
  Var valueOrReason;
  Var promiseVar;
  CallInfo local_84 [2];
  undefined1 local_70 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var result;
  JavascriptPromiseThenFinallyFunction *thenFinallyFunction;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3d8,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3d9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetLibrary(pSVar5);
  this_00 = VarTo<Js::JavascriptPromiseThenFinallyFunction,Js::RecyclableObject>(function);
  pRVar8 = JavascriptPromiseThenFinallyFunction::GetOnFinally(this_00);
  bVar4 = JavascriptConversion::IsCallable(pRVar8);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3e2,
                                "(JavascriptConversion::IsCallable(thenFinallyFunction->GetOnFinally()))"
                                ,
                                "JavascriptConversion::IsCallable(thenFinallyFunction->GetOnFinally())"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
  autoReentrancyHandler._9_7_ = 0;
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_70,pTVar6);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  ThreadContext::AssertJsReentrancy(pTVar6);
  pRVar8 = JavascriptPromiseThenFinallyFunction::GetOnFinally(this_00);
  pRVar9 = JavascriptPromiseThenFinallyFunction::GetOnFinally(this_00);
  p_Var10 = RecyclableObject::GetEntryPoint(pRVar9);
  CheckIsExecutable(pRVar8,p_Var10);
  pRVar8 = JavascriptPromiseThenFinallyFunction::GetOnFinally(this_00);
  p_Var10 = RecyclableObject::GetEntryPoint(pRVar8);
  pRVar8 = JavascriptPromiseThenFinallyFunction::GetOnFinally(this_00);
  CallInfo::CallInfo(local_84,CallFlags_Value,1);
  CVar11 = (CallInfo)JavascriptPromiseThenFinallyFunction::GetOnFinally(this_00);
  CallInfo::CallInfo((CallInfo *)((long)&promiseVar + 4),CallFlags_Value,1);
  pRVar9 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  autoReentrancyHandler._8_8_ =
       (*p_Var10)(pRVar8,CVar11,local_84[0],0,0,0,0,stack0xffffffffffffff74,pRVar9);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_70);
  if (autoReentrancyHandler._8_8_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3ed,"(result)","result");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pRVar8 = JavascriptPromiseThenFinallyFunction::GetConstructor(this_00);
  bVar4 = Js::JavascriptOperators::IsConstructor(pRVar8);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3f1,
                                "(JavascriptOperators::IsConstructor(thenFinallyFunction->GetConstructor()))"
                                ,
                                "JavascriptOperators::IsConstructor(thenFinallyFunction->GetConstructor())"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar2 = autoReentrancyHandler._8_8_;
  pRVar8 = JavascriptPromiseThenFinallyFunction::GetConstructor(this_00);
  pvVar12 = CreateResolvedPromise((Var)uVar2,pSVar5,pRVar8);
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    this_01 = ScriptContext::GetLibrary(pSVar5);
    thunkFinallyFunction =
         (JavascriptPromiseThunkFinallyFunction *)
         JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    thunkFinallyFunction =
         (JavascriptPromiseThunkFinallyFunction *)
         Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  bVar4 = JavascriptPromiseThenFinallyFunction::GetShouldThrow(this_00);
  pJVar13 = JavascriptLibrary::CreatePromiseThunkFinallyFunction
                      (this,EntryThunkFinallyFunction,thunkFinallyFunction,bVar4);
  pRVar8 = Js::JavascriptOperators::ToObject(pvVar12,pSVar5);
  aValue = Js::JavascriptOperators::GetProperty(pRVar8,0x169,pSVar5,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(aValue);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ec34,L"Promise.prototype.finally");
  }
  autoReentrancyHandler_1._8_8_ = VarTo<Js::RecyclableObject>(aValue);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d0,pTVar6);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  ThreadContext::AssertJsReentrancy(pTVar6);
  uVar2 = autoReentrancyHandler_1._8_8_;
  p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler_1._8_8_);
  CheckIsExecutable((RecyclableObject *)uVar2,p_Var10);
  p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler_1._8_8_);
  uVar2 = autoReentrancyHandler_1._8_8_;
  CallInfo::CallInfo(&local_d8,CallFlags_Value,2);
  uVar3 = autoReentrancyHandler_1._8_8_;
  CallInfo::CallInfo(&local_e0,CallFlags_Value,2);
  pvVar12 = (*p_Var10)((RecyclableObject *)uVar2,(CallInfo)uVar3,local_d8,0,0,0,0,local_e0,pvVar12,
                       pJVar13);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d0);
  return pvVar12;
}

Assistant:

Var JavascriptPromise::EntryThenFinallyFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));
        ScriptContext* scriptContext = function->GetScriptContext();

        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromiseThenFinallyFunction* thenFinallyFunction = VarTo<JavascriptPromiseThenFinallyFunction>(function);

        // 1. Let onFinally be F.[[OnFinally]]
        // 2. Assert: IsCallable(onFinally)=true
        Assert(JavascriptConversion::IsCallable(thenFinallyFunction->GetOnFinally()));

        // 3. Let result be ? Call(onFinally, undefined)
        Var result = nullptr;

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            result = CALL_FUNCTION(scriptContext->GetThreadContext(), thenFinallyFunction->GetOnFinally(), CallInfo(CallFlags_Value, 1), library->GetUndefined());
        }
        END_SAFE_REENTRANT_CALL

        Assert(result);

        // 4. Let C be F.[[Constructor]]
        // 5. Assert IsConstructor(C)
        Assert(JavascriptOperators::IsConstructor(thenFinallyFunction->GetConstructor()));

        // 6. Let promise be ? PromiseResolve(c, result)
        Var promiseVar = CreateResolvedPromise(result, scriptContext, thenFinallyFunction->GetConstructor());

        // 7. Let valueThunk be equivalent to a function that returns value
        // OR 7. Let thrower be equivalent to a function that throws reason

        Var valueOrReason = nullptr;

        if (args.Info.Count > 1)
        {
            valueOrReason = args[1];
        }
        else
        {
            valueOrReason = scriptContext->GetLibrary()->GetUndefined();
        }

        JavascriptPromiseThunkFinallyFunction* thunkFinallyFunction = library->CreatePromiseThunkFinallyFunction(EntryThunkFinallyFunction, valueOrReason, thenFinallyFunction->GetShouldThrow());

        // 8. Return ? Invoke(promise, "then", <<valueThunk>>)
        RecyclableObject* promise = JavascriptOperators::ToObject(promiseVar, scriptContext);
        Var funcVar = JavascriptOperators::GetProperty(promise, Js::PropertyIds::then, scriptContext);

        if (!JavascriptConversion::IsCallable(funcVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise.prototype.finally"));
        }

        RecyclableObject* func = VarTo<RecyclableObject>(funcVar);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                func, Js::CallInfo(CallFlags_Value, 2),
                promiseVar,
                thunkFinallyFunction);
        }
        END_SAFE_REENTRANT_CALL
    }